

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_world_help(parser *p)

{
  void *pvVar1;
  char *pcVar2;
  char *desc;
  level_map_conflict *map;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar2 = parser_getstr(p,"text");
    pcVar2 = string_append(*(char **)((long)pvVar1 + 8),pcVar2);
    *(char **)((long)pvVar1 + 8) = pcVar2;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_world_help(struct parser *p) {
	struct level_map *map = parser_priv(p);
	const char *desc;

	if (!map)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	desc = parser_getstr(p, "text");
	map->help = string_append(map->help, desc);
	return PARSE_ERROR_NONE;
}